

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_NewFrame(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  ImGuiMouseCursor IVar5;
  ImGuiIO *pIVar6;
  ImGuiIO *pIVar7;
  float *pfVar8;
  uchar *puVar9;
  GLFWcursor *cursorHandle;
  int i;
  long lVar10;
  bool bVar11;
  float fVar12;
  ImVec2 IVar14;
  float fVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double mouse_x;
  int buttons_count;
  int display_h;
  int display_w;
  int h;
  int w;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  pIVar6 = ImGui::GetIO();
  glfwGetWindowSize(g_Window,(int *)&local_2c,&local_30);
  glfwGetFramebufferSize(g_Window,&local_34,&local_38);
  IVar1.y = (float)local_30;
  IVar1.x = (float)(int)local_2c;
  pIVar6->DisplaySize = IVar1;
  auVar15._4_4_ = 0;
  auVar15._0_4_ = local_2c;
  auVar15._8_4_ = local_30;
  auVar15._12_4_ = 0;
  auVar16._0_4_ = (float)local_34;
  auVar16._4_4_ = (float)local_38;
  auVar16._8_8_ = 0;
  auVar17._4_4_ = (float)(SUB168(auVar15 | _DAT_0019aa70,8) - DAT_0019aa70._8_8_);
  auVar17._0_4_ = (float)(SUB168(auVar15 | _DAT_0019aa70,0) - (double)DAT_0019aa70);
  auVar17._8_8_ = 0;
  auVar17 = divps(auVar16,auVar17);
  IVar14.x = (float)(auVar17._0_4_ & -(uint)(0 < (int)local_2c));
  IVar14.y = (float)(auVar17._4_4_ & -(uint)(0 < local_30));
  pIVar6->DisplayFramebufferScale = IVar14;
  dVar3 = glfwGetTime();
  if (0.0 < g_Time) {
    fVar13 = (float)(dVar3 - g_Time);
  }
  else {
    fVar13 = 0.016666668;
  }
  pIVar6->DeltaTime = fVar13;
  lVar10 = 0;
  g_Time = dVar3;
  pIVar7 = ImGui::GetIO();
  do {
    bVar11 = true;
    if (g_MouseJustPressed[lVar10] == false) {
      iVar4 = glfwGetMouseButton(g_Window,(int)lVar10);
      bVar11 = iVar4 != 0;
    }
    pIVar7->MouseDown[lVar10] = bVar11;
    g_MouseJustPressed[lVar10] = false;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  fVar13 = (pIVar7->MousePos).x;
  fVar12 = (pIVar7->MousePos).y;
  (pIVar7->MousePos).x = -3.4028235e+38;
  (pIVar7->MousePos).y = -3.4028235e+38;
  iVar4 = glfwGetWindowAttrib(g_Window,0x20001);
  if (iVar4 != 0) {
    if (pIVar7->WantSetMousePos == true) {
      glfwSetCursorPos(g_Window,(double)fVar13,(double)fVar12);
    }
    else {
      glfwGetCursorPos(g_Window,(double *)&local_48,(double *)&local_40);
      IVar2.y = (float)(double)CONCAT44(local_40._4_4_,(int)local_40);
      IVar2.x = (float)(double)CONCAT44(local_48._4_4_,(int)local_48);
      pIVar7->MousePos = IVar2;
    }
  }
  pIVar7 = ImGui::GetIO();
  if ((pIVar7->ConfigFlags & 0x20) == 0) {
    iVar4 = glfwGetInputMode(g_Window,0x33001);
    if (iVar4 != 0x34003) {
      IVar5 = ImGui::GetMouseCursor();
      iVar4 = 0x34002;
      if ((IVar5 != -1) && (pIVar7->MouseDrawCursor == false)) {
        cursorHandle = g_MouseCursors[IVar5];
        if (g_MouseCursors[IVar5] == (GLFWcursor *)0x0) {
          cursorHandle = g_MouseCursors[0];
        }
        glfwSetCursor(g_Window,cursorHandle);
        iVar4 = 0x34001;
      }
      glfwSetInputMode(g_Window,0x33001,iVar4);
    }
  }
  pIVar6->NavInputs[0x10] = 0.0;
  pIVar6->NavInputs[0x11] = 0.0;
  pIVar6->NavInputs[0x12] = 0.0;
  pIVar6->NavInputs[0x13] = 0.0;
  pIVar6->NavInputs[0xc] = 0.0;
  pIVar6->NavInputs[0xd] = 0.0;
  pIVar6->NavInputs[0xe] = 0.0;
  pIVar6->NavInputs[0xf] = 0.0;
  pIVar6->NavInputs[8] = 0.0;
  pIVar6->NavInputs[9] = 0.0;
  pIVar6->NavInputs[10] = 0.0;
  pIVar6->NavInputs[0xb] = 0.0;
  pIVar6->NavInputs[4] = 0.0;
  pIVar6->NavInputs[5] = 0.0;
  pIVar6->NavInputs[6] = 0.0;
  pIVar6->NavInputs[7] = 0.0;
  pIVar6->NavInputs[0] = 0.0;
  pIVar6->NavInputs[1] = 0.0;
  pIVar6->NavInputs[2] = 0.0;
  pIVar6->NavInputs[3] = 0.0;
  pIVar6->NavInputs[0x14] = 0.0;
  if ((pIVar6->ConfigFlags & 2) != 0) {
    local_48._0_4_ = 0;
    local_40._0_4_ = 0;
    pfVar8 = glfwGetJoystickAxes(0,(int *)&local_48);
    puVar9 = glfwGetJoystickButtons(0,(int *)&local_40);
    if ((0 < (int)local_40) && (*puVar9 == '\x01')) {
      pIVar6->NavInputs[0] = 1.0;
    }
    if ((1 < (int)local_40) && (puVar9[1] == '\x01')) {
      pIVar6->NavInputs[1] = 1.0;
    }
    if ((2 < (int)local_40) && (puVar9[2] == '\x01')) {
      pIVar6->NavInputs[3] = 1.0;
    }
    if ((3 < (int)local_40) && (puVar9[3] == '\x01')) {
      pIVar6->NavInputs[2] = 1.0;
    }
    if ((0xd < (int)local_40) && (puVar9[0xd] == '\x01')) {
      pIVar6->NavInputs[4] = 1.0;
    }
    if ((0xb < (int)local_40) && (puVar9[0xb] == '\x01')) {
      pIVar6->NavInputs[5] = 1.0;
    }
    if ((10 < (int)local_40) && (puVar9[10] == '\x01')) {
      pIVar6->NavInputs[6] = 1.0;
    }
    if ((0xc < (int)local_40) && (puVar9[0xc] == '\x01')) {
      pIVar6->NavInputs[7] = 1.0;
    }
    if ((4 < (int)local_40) && (puVar9[4] == '\x01')) {
      pIVar6->NavInputs[0xc] = 1.0;
    }
    if ((5 < (int)local_40) && (puVar9[5] == '\x01')) {
      pIVar6->NavInputs[0xd] = 1.0;
    }
    if ((4 < (int)local_40) && (puVar9[4] == '\x01')) {
      pIVar6->NavInputs[0xe] = 1.0;
    }
    if ((5 < (int)local_40) && (puVar9[5] == '\x01')) {
      pIVar6->NavInputs[0xf] = 1.0;
    }
    if ((int)local_48 < 1) {
      fVar13 = 0.0;
    }
    else {
      fVar13 = *pfVar8 + 0.3;
    }
    fVar12 = 1.0;
    if (fVar13 / -0.59999996 <= 1.0) {
      fVar12 = fVar13 / -0.59999996;
    }
    if (pIVar6->NavInputs[8] <= fVar12 && fVar12 != pIVar6->NavInputs[8]) {
      pIVar6->NavInputs[8] = fVar12;
    }
    if ((int)local_48 < 1) {
      fVar13 = 0.0;
    }
    else {
      fVar13 = *pfVar8 + -0.3;
    }
    fVar12 = 1.0;
    if (fVar13 / 0.59999996 <= 1.0) {
      fVar12 = fVar13 / 0.59999996;
    }
    if (pIVar6->NavInputs[9] <= fVar12 && fVar12 != pIVar6->NavInputs[9]) {
      pIVar6->NavInputs[9] = fVar12;
    }
    fVar13 = 0.0;
    if (1 < (int)local_48) {
      fVar13 = pfVar8[1] + -0.3;
    }
    fVar12 = 1.0;
    if (fVar13 / 0.59999996 <= 1.0) {
      fVar12 = fVar13 / 0.59999996;
    }
    if (pIVar6->NavInputs[10] <= fVar12 && fVar12 != pIVar6->NavInputs[10]) {
      pIVar6->NavInputs[10] = fVar12;
    }
    fVar13 = 0.0;
    if (1 < (int)local_48) {
      fVar13 = pfVar8[1] + 0.3;
    }
    fVar12 = 1.0;
    if (fVar13 / -0.59999996 <= 1.0) {
      fVar12 = fVar13 / -0.59999996;
    }
    if (pIVar6->NavInputs[0xb] <= fVar12 && fVar12 != pIVar6->NavInputs[0xb]) {
      pIVar6->NavInputs[0xb] = fVar12;
    }
    pIVar6->BackendFlags =
         (uint)(0 < (int)local_40 && 0 < (int)local_48) | pIVar6->BackendFlags & 0xfffffffeU;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    io.DisplayFramebufferScale = ImVec2(w > 0 ? ((float)display_w / w) : 0, h > 0 ? ((float)display_h / h) : 0);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    ImGui_ImplGlfw_UpdateMousePosAndButtons();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Gamepad navigation mapping
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    {
        // Update gamepad inputs
        #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
        #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
        int axes_count = 0, buttons_count = 0;
        const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
        const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
        MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
        MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
        MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
        MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
        MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
        MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
        MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
        MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
        MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
        MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
        MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
        #undef MAP_BUTTON
        #undef MAP_ANALOG
        if (axes_count > 0 && buttons_count > 0)
            io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
        else
            io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    }
}